

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * duckdb::Exception::ConstructMessageRecursive<duckdb_libpgquery::VariableSetScope>
                   (string *__return_storage_ptr__,string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,VariableSetScope param)

{
  ExceptionFormatValue EStack_58;
  
  ExceptionFormatValue::ExceptionFormatValue(&EStack_58,(ulong)param);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>(values,&EStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)EStack_58.str_val._M_dataplus._M_p != &EStack_58.str_val.field_2) {
    operator_delete(EStack_58.str_val._M_dataplus._M_p);
  }
  ConstructMessageRecursive
            (__return_storage_ptr__,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}